

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

ssize_t mqtt_unpack_publish_response(mqtt_response *mqtt_response,uint8_t *buf)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ushort uVar4;
  ssize_t sVar5;
  ushort *puVar6;
  ulong uVar7;
  byte bVar8;
  
  bVar1 = (mqtt_response->fixed_header).field_0x4;
  (mqtt_response->decoded).connack.session_present_flag = bVar1 >> 3 & 1;
  bVar8 = bVar1 >> 1 & 3;
  (mqtt_response->decoded).publish.qos_level = bVar8;
  (mqtt_response->decoded).publish.retain_flag = bVar1 & 1;
  uVar2 = (mqtt_response->fixed_header).remaining_length;
  sVar5 = -0x7ffffff4;
  if (3 < uVar2) {
    uVar4 = *(ushort *)buf << 8 | *(ushort *)buf >> 8;
    (mqtt_response->decoded).publish.topic_name_size = uVar4;
    (mqtt_response->decoded).suback.return_codes = buf + 2;
    puVar6 = (ushort *)(buf + (ulong)uVar4 + 2);
    if (bVar8 == 0) {
      iVar3 = -2;
    }
    else {
      (mqtt_response->decoded).publish.packet_id = *puVar6 << 8 | *puVar6 >> 8;
      puVar6 = (ushort *)(buf + (ulong)uVar4 + 4);
      iVar3 = -4;
    }
    uVar7 = (ulong)((uVar2 + iVar3) - (uint)uVar4);
    (mqtt_response->decoded).publish.application_message = puVar6;
    (mqtt_response->decoded).publish.application_message_size = uVar7;
    sVar5 = (long)puVar6 + (uVar7 - (long)buf);
  }
  return sVar5;
}

Assistant:

ssize_t mqtt_unpack_publish_response(struct mqtt_response *mqtt_response, const uint8_t *buf)
{    
    const uint8_t *const start = buf;
    struct mqtt_fixed_header *fixed_header;
    struct mqtt_response_publish *response;
    
    fixed_header = &(mqtt_response->fixed_header);
    response = &(mqtt_response->decoded.publish);

    /* get flags */
    response->dup_flag = (fixed_header->control_flags & MQTT_PUBLISH_DUP) >> 3;
    response->qos_level = (fixed_header->control_flags & MQTT_PUBLISH_QOS_MASK) >> 1;
    response->retain_flag = fixed_header->control_flags & MQTT_PUBLISH_RETAIN;

    /* make sure that remaining length is valid */
    if (mqtt_response->fixed_header.remaining_length < 4) {
        return MQTT_ERROR_MALFORMED_RESPONSE;
    }

    /* parse variable header */
    response->topic_name_size = __mqtt_unpack_uint16(buf);
    buf += 2;
    response->topic_name = buf;
    buf += response->topic_name_size;

    if (response->qos_level > 0) {
        response->packet_id = __mqtt_unpack_uint16(buf);
        buf += 2;
    }

    /* get payload */
    response->application_message = buf;
    if (response->qos_level == 0) {
        response->application_message_size = fixed_header->remaining_length - response->topic_name_size - 2;
    } else {
        response->application_message_size = fixed_header->remaining_length - response->topic_name_size - 4;
    }
    buf += response->application_message_size;
    
    /* return number of bytes consumed */
    return buf - start;
}